

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

bool __thiscall
QTableModel::dropMimeData
          (QTableModel *this,QMimeData *data,DropAction action,int row,int column,QModelIndex *index
          )

{
  bool bVar1;
  byte bVar2;
  QTableWidget *pQVar3;
  int in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  int in_R8D;
  QModelIndex *in_R9;
  long in_FS_OFFSET;
  QTableWidget *view;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  int local_3c;
  int local_38;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QModelIndex::isValid
                    ((QModelIndex *)
                     CONCAT17(in_stack_ffffffffffffffa7,
                              CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
  if (bVar1) {
    local_38 = QModelIndex::row(in_R9);
    local_3c = QModelIndex::column(in_R9);
  }
  else {
    if ((in_ECX == -1) || (local_38 = in_ECX, in_R8D == -1)) {
      QModelIndex::QModelIndex((QModelIndex *)0x8d81a2);
      local_38 = (**(code **)(*in_RDI + 0x78))(in_RDI,local_20);
    }
    local_3c = 0;
  }
  pQVar3 = QTableModel::view((QTableModel *)0x8d81d4);
  if (pQVar3 == (QTableWidget *)0x0) {
    bVar2 = 0;
  }
  else {
    bVar2 = (**(code **)(*(long *)&(pQVar3->super_QTableView).super_QAbstractItemView.
                                   super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x310))
                      (pQVar3,local_38,local_3c,in_RSI,in_EDX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool QTableModel::dropMimeData(const QMimeData *data, Qt::DropAction action,
                              int row , int column, const QModelIndex &index)
{
    if (index.isValid()) {
        row = index.row();
        column = index.column();
    } else if (row == -1 || column == -1) { // The user dropped outside the table.
        row = rowCount();
        column = 0;
    } else { // The user dropped between two rows
        // This means inserting a row, which only makes sense at column 0
        column = 0;
    }

    QTableWidget *view = this->view();
    return (view ? view->dropMimeData(row, column, data, action) : false);
}